

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_keywords.cpp
# Opt level: O2

void duckdb::DuckDBKeywordsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GlobalTableFunctionState *pGVar2;
  reference pvVar3;
  InternalException *this;
  _func_int **pp_Var4;
  ulong index;
  _func_int **__n;
  _func_int **pp_Var5;
  allocator local_e9;
  DataChunk *local_e8;
  string category_name;
  string local_b0;
  string local_90;
  Value local_70;
  
  local_e8 = output;
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  pp_Var5 = pGVar2[1]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar2[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var4 - (long)pp_Var5) / 0x28)) {
    paVar1 = &category_name.field_2;
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var4 - (long)pp_Var5) / 0x28) && (index < 0x800));
        index = index + 1) {
      pGVar2[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar3 = vector<duckdb::ParserKeyword,_true>::get<true>
                         ((vector<duckdb::ParserKeyword,_true> *)(pGVar2 + 1),(size_type)__n);
      ::std::__cxx11::string::string((string *)&local_90,(string *)pvVar3);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(local_e8,0,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      category_name._M_string_length = 0;
      category_name.field_2._M_local_buf[0] = '\0';
      category_name._M_dataplus._M_p = (pointer)paVar1;
      if (KEYWORD_COL_NAME < pvVar3->category) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Unrecognized keyword category",&local_e9);
        InternalException::InternalException(this,(string *)&local_70);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::assign((char *)&category_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)category_name._M_dataplus._M_p == paVar1) {
        local_b0.field_2._8_8_ = category_name.field_2._8_8_;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0._M_dataplus._M_p = category_name._M_dataplus._M_p;
      }
      local_b0.field_2._M_allocated_capacity._1_7_ =
           category_name.field_2._M_allocated_capacity._1_7_;
      local_b0.field_2._M_local_buf[0] = category_name.field_2._M_local_buf[0];
      local_b0._M_string_length = category_name._M_string_length;
      category_name._M_string_length = 0;
      category_name.field_2._M_local_buf[0] = '\0';
      category_name._M_dataplus._M_p = (pointer)paVar1;
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(local_e8,1,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&category_name);
      __n = pGVar2[4]._vptr_GlobalTableFunctionState;
      pp_Var5 = pGVar2[1]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar2[2]._vptr_GlobalTableFunctionState;
    }
    local_e8->count = index;
  }
  return;
}

Assistant:

void DuckDBKeywordsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBKeywordsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];

		// keyword_name, VARCHAR
		output.SetValue(0, count, Value(entry.name));
		// keyword_category, VARCHAR
		string category_name;
		switch (entry.category) {
		case KeywordCategory::KEYWORD_RESERVED:
			category_name = "reserved";
			break;
		case KeywordCategory::KEYWORD_UNRESERVED:
			category_name = "unreserved";
			break;
		case KeywordCategory::KEYWORD_TYPE_FUNC:
			category_name = "type_function";
			break;
		case KeywordCategory::KEYWORD_COL_NAME:
			category_name = "column_name";
			break;
		default:
			throw InternalException("Unrecognized keyword category");
		}
		output.SetValue(1, count, Value(std::move(category_name)));

		count++;
	}
	output.SetCardinality(count);
}